

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)

{
  bool bVar1;
  SQObjectPtr *o_00;
  SQObjectValue local_38;
  SQObjectPtr *o;
  SQInteger *i_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  o_00 = stack_get(v,idx);
  if (((o_00->super_SQObject)._type & 0x4000000) == 0) {
    if ((o_00->super_SQObject)._type == OT_BOOL) {
      bVar1 = SQVM::IsFalse(o_00);
      *i = (long)(int)(uint)!bVar1;
      v_local = (HSQUIRRELVM)0x0;
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  else {
    if ((o_00->super_SQObject)._type == OT_FLOAT) {
      local_38.nInteger = (SQInteger)(o_00->super_SQObject)._unVal.fFloat;
    }
    else {
      local_38 = (o_00->super_SQObject)._unVal;
    }
    *i = (SQInteger)local_38;
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *i = tointeger(o);
        return SQ_OK;
    }
    if(sq_isbool(o)) {
        *i = SQVM::IsFalse(o)?SQFalse:SQTrue;
        return SQ_OK;
    }
    return SQ_ERROR;
}